

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O0

char * vrna_strdup_vprintf(char *format,__va_list_tag *argp)

{
  int iVar1;
  char *__s;
  char *buf;
  va_list copy;
  int local_24;
  int count;
  int r;
  char *result;
  __va_list_tag *argp_local;
  char *format_local;
  
  _count = (char *)0x0;
  copy[0].overflow_arg_area = argp->reg_save_area;
  buf = *(char **)argp;
  copy[0]._0_8_ = argp->overflow_arg_area;
  local_24 = -1;
  iVar1 = vsnprintf((char *)0x0,0,format,argp);
  __s = _count;
  if ((-1 < iVar1) && (iVar1 < 0x7fffffff)) {
    __s = (char *)vrna_alloc(iVar1 + 1);
    if (__s == (char *)0x0) {
      local_24 = -1;
      __s = _count;
    }
    else {
      local_24 = vsnprintf(__s,(long)(iVar1 + 1),format,&buf);
      if (local_24 < 0) {
        free(__s);
        __s = _count;
      }
    }
  }
  _count = __s;
  if (local_24 == -1) {
    vrna_message_warning("vrna_strdup_printf: memory allocation failure!");
    _count = (char *)0x0;
  }
  return _count;
}

Assistant:

PUBLIC char *
vrna_strdup_vprintf(const char  *format,
                    va_list     argp)
{
  char    *result;
  int     r;

  result = NULL;

#ifndef HAVE_VASPRINTF
  int     count;
  va_list copy;
  va_copy(copy, argp);

  r = -1;

  /* retrieve the number of characters that the string requires */
#ifdef _WIN32
  /*
   * vsnprintf() in Windows is not ANSI compliant, although it's
   * "...included for compliance to the ANSI standard"
   * Thus, we use _vscprintf() that explicitly counts characters
   */
  count = _vscprintf(format, argp);
#else
  count = vsnprintf(NULL, 0, format, argp);
#endif

  if ((count >= 0) && (count < INT_MAX)) {
    char *buf = (char *)vrna_alloc(sizeof(char) * (count + 1));
    if (buf == NULL)
      r = -1;
    else if ((r = vsnprintf(buf, count + 1, format, copy)) < 0)
      free(buf);
    else
      result = buf;
  }

  va_end(copy);  /* Each va_start() or va_copy() needs a va_end() */
#else
  /* the default is to use vasprintf() if available */
  r = vasprintf(&result, format, argp);
#endif

  /* check for any memory allocation error indicated by r == -1 */
  if (r == -1) {
    vrna_message_warning("vrna_strdup_printf: memory allocation failure!");
    result = NULL;
  }

  return result;
}